

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O1

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  undefined4 uVar1;
  int iVar2;
  pointer pPVar3;
  pointer psVar4;
  pointer pLVar5;
  ulong uVar6;
  ulong uVar7;
  ParticleFilter *pPVar8;
  long lVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  double dVar11;
  LandmarkObs *pLVar12;
  double dVar13;
  LandmarkObs *pLVar14;
  double dVar15;
  double dVar16;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations_in_map_coordinates;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> map_landmarks_in_range;
  LandmarkObs l_1;
  LandmarkObs local_e8;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_a8;
  ulong local_88;
  ParticleFilter *local_80;
  long local_78;
  double local_70;
  double local_68;
  LandmarkObs local_60;
  void *local_48;
  
  pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    local_88 = 0;
    local_80 = this;
    local_68 = sensor_range;
    do {
      local_78 = local_88 * 5;
      local_c0 = pPVar3[local_88].x;
      local_c8 = pPVar3[local_88].y;
      dVar13 = pPVar3[local_88].theta;
      local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_finish = (LandmarkObs *)0x0;
      local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (LandmarkObs *)0x0;
      psVar4 = (map_landmarks->landmark_list).
               super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((map_landmarks->landmark_list).
          super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
          _M_impl.super__Vector_impl_data._M_finish != psVar4) {
        lVar9 = 8;
        uVar7 = 0;
        do {
          pLVar12 = (LandmarkObs *)(double)*(float *)((long)psVar4 + lVar9 + -4);
          uVar1 = *(undefined4 *)((long)psVar4 + lVar9 + -8);
          pLVar14 = (LandmarkObs *)(double)*(float *)((long)&psVar4->id_i + lVar9);
          dVar15 = ((double)pLVar12 - local_c0) * ((double)pLVar12 - local_c0) +
                   ((double)pLVar14 - local_c8) * ((double)pLVar14 - local_c8);
          if (dVar15 < 0.0) {
            dVar15 = sqrt(dVar15);
          }
          else {
            dVar15 = SQRT(dVar15);
          }
          if (dVar15 < local_68) {
            local_e8.id = uVar1;
            local_e8.x = (double)pLVar12;
            local_e8.y = (double)pLVar14;
            if (local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
              _M_realloc_insert<LandmarkObs_const&>
                        ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_a8,
                         (iterator)
                         local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_e8);
            }
            else {
              (local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_finish)->y = (double)pLVar14;
              (local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_finish)->id = uVar1;
              *(undefined4 *)
               &(local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                 super__Vector_impl_data._M_finish)->field_0x4 = local_e8._4_4_;
              (local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = (double)pLVar12;
              local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar7 = uVar7 + 1;
          psVar4 = (map_landmarks->landmark_list).
                   super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(map_landmarks->landmark_list).
                         super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 2) *
                  -0x5555555555555555;
          lVar9 = lVar9 + 0xc;
        } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
      }
      local_e8._0_8_ = (LandmarkObs *)0x0;
      local_e8.x = 0.0;
      local_e8.y = 0.0;
      pLVar5 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if ((observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
          super__Vector_impl_data._M_finish != pLVar5) {
        lVar9 = 0x10;
        uVar7 = 0;
        do {
          iVar2 = *(int *)((long)pLVar5 + lVar9 + -0x10);
          dVar15 = *(double *)((long)&pLVar5->id + lVar9);
          local_b8._0_8_ = *(double *)((long)pLVar5 + lVar9 + -8);
          dVar10 = cos(dVar13);
          dVar10 = dVar10 * (double)local_b8._0_8_ + local_c0;
          dVar11 = sin(dVar13);
          dVar10 = dVar10 - dVar11 * dVar15;
          dVar11 = sin(dVar13);
          local_b8._0_8_ = dVar11 * (double)local_b8._0_8_ + local_c8;
          dVar11 = cos(dVar13);
          local_60.y = dVar11 * dVar15 + (double)local_b8._0_8_;
          local_60.id = iVar2;
          local_60.x = dVar10;
          if (local_e8.x == local_e8.y) {
            std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
            _M_realloc_insert<LandmarkObs_const&>
                      ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_e8,
                       (iterator)local_e8.x,&local_60);
          }
          else {
            *(double *)((long)local_e8.x + 0x10) = local_60.y;
            *(ulong *)local_e8.x = CONCAT44(local_60._4_4_,iVar2);
            *(double *)((long)local_e8.x + 8) = dVar10;
            local_e8.x = (double)((long)local_e8.x + 0x18);
          }
          uVar7 = uVar7 + 1;
          pLVar5 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(observations->
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pLVar5 >> 3) *
                  -0x5555555555555555;
          lVar9 = lVar9 + 0x18;
        } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
      }
      pPVar8 = (ParticleFilter *)&local_48;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
                ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_48,&local_a8);
      dataAssociation(pPVar8,(vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_48,
                      (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_e8);
      pPVar8 = local_80;
      uVar7 = local_88;
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if (local_e8.x == (double)local_e8._0_8_) {
        dVar13 = 1.0;
      }
      else {
        lVar9 = 0x10;
        uVar7 = 0;
        do {
          dVar11 = *(double *)(local_e8._0_8_ + lVar9 + -8) - local_c0;
          dVar16 = *(double *)((long)(int *)local_e8._0_8_ + lVar9) - local_c8;
          iVar2 = *(int *)(local_e8._0_8_ + lVar9 + -0x10);
          dVar13 = local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2].x;
          dVar15 = local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2].y;
          dVar10 = dVar11 * dVar11 + dVar16 * dVar16;
          if (dVar10 < 0.0) {
            local_b8._0_8_ = dVar11;
            local_70 = dVar16;
            dVar10 = sqrt(dVar10);
            dVar11 = (double)local_b8._0_8_;
            dVar16 = local_70;
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          dVar13 = dVar13 - local_c0;
          dVar15 = dVar15 - local_c8;
          dVar11 = atan2(dVar16,dVar11);
          local_b8._8_4_ = extraout_XMM0_Dc;
          local_b8._0_8_ = dVar11;
          local_b8._12_4_ = extraout_XMM0_Dd;
          dVar11 = dVar13 * dVar13 + dVar15 * dVar15;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          dVar16 = atan2(dVar15,dVar13);
          dVar13 = *std_landmark;
          dVar15 = std_landmark[1];
          dVar13 = exp(-((((double)local_b8._0_8_ - dVar16) * ((double)local_b8._0_8_ - dVar16)) /
                         ((dVar15 + dVar15) * dVar15) +
                        ((dVar10 - dVar11) * (dVar10 - dVar11)) / ((dVar13 + dVar13) * dVar13)));
          uVar7 = uVar7 + 1;
          uVar6 = ((long)local_e8.x - local_e8._0_8_ >> 3) * -0x5555555555555555;
          lVar9 = lVar9 + 0x18;
        } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
        dVar13 = dVar13 / (*std_landmark * 6.283185307179586 * std_landmark[1]);
        uVar7 = local_88;
      }
      (&((pPVar8->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
         super__Vector_impl_data._M_start)->weight)[local_78] = dVar13;
      (pPVar8->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = dVar13;
      if ((LandmarkObs *)local_e8._0_8_ != (LandmarkObs *)0x0) {
        operator_delete((void *)local_e8._0_8_);
      }
      if (local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_88 = uVar7 + 1;
      pPVar3 = (pPVar8->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(pPVar8->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
              -0x3333333333333333;
    } while (local_88 <= uVar7 && uVar7 - local_88 != 0);
  }
  return;
}

Assistant:

void ParticleFilter::updateWeights(double sensor_range, double std_landmark[], std::vector<LandmarkObs> observations, Map map_landmarks) {
  std::vector<Particle> new_particles;
  std::vector<double> new_weights;
  for (int i=0; i<particles.size(); i++)
  {
    double p_x = particles[i].x;
    double p_y = particles[i].y;
    double p_theta = particles[i].theta;

    // Find map landmarks within the sensor range of the particle
    std::vector<LandmarkObs> map_landmarks_in_range;
    for (int j=0; j<map_landmarks.landmark_list.size(); j++)
    {
      int index = map_landmarks.landmark_list[j].id_i;
      double m_x = map_landmarks.landmark_list[j].x_f;
      double m_y = map_landmarks.landmark_list[j].y_f;
      if (dist(p_x, p_y, m_x, m_y) < sensor_range)
      {
        LandmarkObs l = {index, m_x, m_y};
        map_landmarks_in_range.push_back(l); 
      }
    }

    // Change observation coordinates to map coordinates
    std::vector<LandmarkObs> observations_in_map_coordinates;
    for (int j=0; j<observations.size(); j++)
    {
      int index = observations[j].id;
      double o_x = observations[j].x;
      double o_y = observations[j].y;
      double m_x = p_x + o_x * cos(p_theta) - o_y * sin(p_theta);
      double m_y = p_y + o_x * sin(p_theta) + o_y * cos(p_theta); 
      LandmarkObs l = {index, m_x, m_y};
      observations_in_map_coordinates.push_back(l); 
    }

    // Use the data association method 
    dataAssociation(map_landmarks_in_range, observations_in_map_coordinates);

    // Compute the new weight based on two vectors from point to observation and landmark
    double new_weight = 1.0; 
    for (int j=0; j<observations_in_map_coordinates.size(); j++)
    {
      double o_x = observations_in_map_coordinates[j].x - p_x;
      double o_y = observations_in_map_coordinates[j].y - p_y;
      int map_index = observations_in_map_coordinates[j].id;
      double m_x = map_landmarks_in_range[map_index].x - p_x;
      double m_y = map_landmarks_in_range[map_index].y - p_y;
      double o_length = sqrt(o_x * o_x + o_y * o_y);
      double o_angle = atan2(o_y, o_x);
      double m_length = sqrt(m_x * m_x + m_y * m_y);
      double m_angle = atan2(m_y, m_x);
      double delta_length = o_length - m_length;
      double delta_angle = o_angle - m_angle; 	

      // Bivariate Gaussian
      double num_a = delta_length * delta_length / (2.0 * std_landmark[0] * std_landmark[0]);
      double num_b = delta_angle * delta_angle / (2.0 * std_landmark[1] * std_landmark[1]);
      double numerator = exp(-1.0 * (num_a + num_b));
      double denominator = 2.0 * M_PI * std_landmark[0] * std_landmark[1];
      new_weight = numerator / denominator;
    } 
    particles[i].weight = new_weight;
    weights[i] = new_weight;
  }
}